

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  bool bVar1;
  int iVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long *plVar6;
  EnumDescriptor *pEVar7;
  undefined8 *puVar8;
  int32 value;
  int32 extraout_EDX;
  int32 extraout_EDX_00;
  int32 extraout_EDX_01;
  int32 extraout_EDX_02;
  int32 extraout_EDX_03;
  int32 extraout_EDX_04;
  int32 extraout_EDX_05;
  int32 extraout_EDX_06;
  int32 extraout_EDX_07;
  int32 extraout_EDX_08;
  int32 extraout_EDX_09;
  int32 extraout_EDX_10;
  int32 extraout_EDX_11;
  int32 value_00;
  size_type sVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  _Alloc_hider _Var11;
  long lVar12;
  string out_1;
  string out;
  string local_d0;
  string local_b0;
  long local_90;
  allocator local_81;
  undefined1 local_80 [32];
  FieldDescriptor *local_60;
  long local_58;
  FieldDescriptor local_50 [16];
  _func_void_FieldDescriptor_ptr *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  lVar12 = *(long *)(field + 0x58);
  GenerateFieldDocComment(printer,field,(int)CONCAT71(in_register_00000031,is_descriptor),2);
  if (lVar12 == 0) {
    UnderscoresToCamelCase(&local_d0,*(string **)field,true);
    io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"public function get^camel_name^()\n{\n    return $this->^name^;\n}\n\n",
               (char (*) [11])"camel_name",&local_d0,(char (*) [5])0x3958cc,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    UnderscoresToCamelCase(&local_d0,*(string **)field,true);
    IntToString_abi_cxx11_(&local_b0,(php *)(ulong)*(uint *)(field + 0x44),value);
    io::Printer::Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,
               "public function get^camel_name^()\n{\n    return $this->readOneof(^number^);\n}\n\n"
               ,(char (*) [11])"camel_name",&local_d0,(char (*) [7])0x3b3c9d,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b0._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
               (FieldDescriptor **)&local_b0);
  }
  if (((*(int *)(field + 0x38) != 0xb) ||
      (bVar1 = FieldDescriptor::is_map_message_type(field), !bVar1)) &&
     (*(int *)(field + 0x3c) != 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                 (FieldDescriptor **)&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        pDVar3 = FieldDescriptor::message_type(field);
        iVar2 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar3 + 0x10));
        if (iVar2 == 0) {
          GenerateWrapperFieldGetterDocComment(printer,field);
          UnderscoresToCamelCase(&local_d0,*(string **)field,true);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,
                     "public function get^camel_name^Unwrapped()\n{\n    $wrapper = $this->get^camel_name^();\n    return is_null($wrapper) ? null : $wrapper->getValue();\n}\n\n"
                     ,(char (*) [11])"camel_name",&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
      }
    }
  }
  local_90 = lVar12;
  GenerateFieldDocComment(printer,field,(uint)is_descriptor,1);
  UnderscoresToCamelCase(&local_d0,*(string **)field,true);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer,"public function set^camel_name^($var)\n{\n",(char (*) [11])"camel_name",
             &local_d0);
  paVar5 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar5) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b0._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
               (FieldDescriptor **)&local_b0);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar1 = FieldDescriptor::is_map_message_type(field), bVar1)) {
    pDVar3 = FieldDescriptor::message_type(field);
    local_d0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"key","");
    pFVar4 = Descriptor::FindFieldByName(pDVar3,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"value","");
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)Descriptor::FindFieldByName(pDVar3,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
      local_80._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,
                 &local_60);
    }
    std::__cxx11::string::string
              ((string *)&local_b0,
               *(char **)(FieldDescriptor::kTypeToName + (ulong)*(uint *)(pFVar4 + 0x38) * 8),
               &local_81);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._M_dataplus._M_p,
               (FieldDescriptor *)(local_b0._M_dataplus._M_p + local_b0._M_string_length));
    if (local_d0._M_string_length != 0) {
      sVar9 = 0;
      do {
        if ((byte)((char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar9) + 0x9fU) < 0x1a) {
          *(char *)(local_d0._M_dataplus._M_p + sVar9) =
               (char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar9) + -0x20;
        }
        sVar9 = sVar9 + 1;
      } while (local_d0._M_string_length != sVar9);
    }
    if (*(once_flag **)(paVar5->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_40 = FieldDescriptor::TypeOnceInit;
      local_38 = paVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar5->_M_local_buf + 0x30),&local_40,
                 (FieldDescriptor **)&local_38);
    }
    std::__cxx11::string::string
              ((string *)&local_60,
               *(char **)(FieldDescriptor::kTypeToName +
                         (ulong)*(uint *)(paVar5->_M_local_buf + 0x38) * 8),(allocator *)&local_40);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_80,local_60,local_60 + local_58);
    if (local_80._8_8_ != 0) {
      sVar9 = 0;
      do {
        if ((byte)((char)*(_func_void_FieldDescriptor_ptr *)(local_80._0_8_ + sVar9) + 0x9fU) < 0x1a
           ) {
          *(char *)(local_80._0_8_ + sVar9) =
               (char)*(_func_void_FieldDescriptor_ptr *)(local_80._0_8_ + sVar9) + -0x20;
        }
        sVar9 = sVar9 + 1;
      } while (local_80._8_8_ != sVar9);
    }
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
               ,(char (*) [9])0x3cd0dc,&local_d0,(char (*) [11])0x3cd1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (*(once_flag **)(paVar5->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)paVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar5->_M_local_buf + 0x30),
                 (_func_void_FieldDescriptor_ptr **)&local_d0,(FieldDescriptor **)&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                (ulong)*(uint *)(paVar5->_M_local_buf + 0x38) * 4) == 10) {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)paVar5->_M_local_buf);
      FullClassName<google::protobuf::Descriptor>(&local_b0,pDVar3,is_descriptor);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar5) {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar5;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x399773,&local_d0);
      value_00 = extraout_EDX_06;
    }
    else {
      if (*(once_flag **)(paVar5->_M_local_buf + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)paVar5;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(paVar5->_M_local_buf + 0x30),
                   (_func_void_FieldDescriptor_ptr **)&local_d0,(FieldDescriptor **)&local_b0);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                  (ulong)*(uint *)(paVar5->_M_local_buf + 0x38) * 4) != 8) {
LAB_0026835e:
        io::Printer::Print<>(printer,");\n");
        lVar12 = local_90;
        value_00 = extraout_EDX_01;
        goto LAB_002685d5;
      }
      pEVar7 = FieldDescriptor::enum_type((FieldDescriptor *)paVar5->_M_local_buf);
      FullClassName<google::protobuf::EnumDescriptor>(&local_b0,pEVar7,is_descriptor);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar5) {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = paVar5;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x399773,&local_d0);
      value_00 = extraout_EDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      value_00 = extraout_EDX_10;
    }
    paVar5 = &local_b0.field_2;
    _Var11._M_p = local_b0._M_dataplus._M_p;
LAB_002685c6:
    bVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p == paVar5;
  }
  else {
    if (*(int *)(field + 0x3c) != 3) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        pDVar3 = FieldDescriptor::message_type(field);
        LegacyFullClassName<google::protobuf::Descriptor>(&local_d0,pDVar3,is_descriptor);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,"GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                   (char (*) [11])0x399773,&local_d0);
        value_00 = extraout_EDX;
      }
      else {
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_b0._M_dataplus._M_p = (pointer)field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                     (FieldDescriptor **)&local_b0);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 8)
        {
          if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
            local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_b0._M_dataplus._M_p = (pointer)field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                       (FieldDescriptor **)&local_b0);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 9
             ) {
            if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
              local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
              local_b0._M_dataplus._M_p = (pointer)field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                         (FieldDescriptor **)&local_b0);
            }
            pcVar10 = "False";
            if (*(int *)(field + 0x38) == 9) {
              pcVar10 = "True";
            }
            local_d0._M_dataplus._M_p = pcVar10;
            io::Printer::Print<char[5],char_const*>
                      (printer,"GPBUtil::checkString($var, ^utf8^);\n",(char (*) [5])0x3e5419,
                       (char **)&local_d0);
            lVar12 = local_90;
            value_00 = extraout_EDX_02;
            goto LAB_002685d5;
          }
          if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
            local_80._0_8_ = FieldDescriptor::TypeOnceInit;
            local_60 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,
                       &local_60);
          }
          std::__cxx11::string::string
                    ((string *)&local_b0,
                     *(char **)(FieldDescriptor::kCppTypeToName +
                               (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(field + 0x38) * 4) * 8),
                     (allocator *)local_80);
          UnderscoresToCamelCase(&local_d0,&local_b0,true);
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,"GPBUtil::check^type^($var);\n",(char (*) [5])0x3eb793,&local_d0);
          value_00 = extraout_EDX_04;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
            value_00 = extraout_EDX_05;
          }
          paVar5 = &local_b0.field_2;
          _Var11._M_p = local_b0._M_dataplus._M_p;
          goto LAB_002685c6;
        }
        pEVar7 = FieldDescriptor::enum_type(field);
        LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_d0,pEVar7,is_descriptor);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,"GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                   (char (*) [11])0x399773,&local_d0);
        value_00 = extraout_EDX_00;
      }
      paVar5 = &local_d0.field_2;
      _Var11._M_p = local_d0._M_dataplus._M_p;
      goto LAB_002685c6;
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_80._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,&local_60
                );
    }
    std::__cxx11::string::string
              ((string *)&local_b0,
               *(char **)(FieldDescriptor::kTypeToName + (ulong)*(uint *)(field + 0x38) * 8),
               (allocator *)local_80);
    local_d0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._M_dataplus._M_p,
               (FieldDescriptor *)(local_b0._M_dataplus._M_p + local_b0._M_string_length));
    if (local_d0._M_string_length != 0) {
      sVar9 = 0;
      do {
        if ((byte)((char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar9) + 0x9fU) < 0x1a) {
          *(char *)(local_d0._M_dataplus._M_p + sVar9) =
               (char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar9) + -0x20;
        }
        sVar9 = sVar9 + 1;
      } while (local_d0._M_string_length != sVar9);
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
               ,(char (*) [5])0x3eb793,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar5) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                 (FieldDescriptor **)&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
      pDVar3 = FieldDescriptor::message_type(field);
      FullClassName<google::protobuf::Descriptor>(&local_b0,pDVar3,is_descriptor);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar5) {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = paVar5;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x399773,&local_d0);
      value_00 = extraout_EDX_03;
    }
    else {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 8)
      goto LAB_0026835e;
      pEVar7 = FieldDescriptor::enum_type(field);
      FullClassName<google::protobuf::EnumDescriptor>(&local_b0,pEVar7,is_descriptor);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar5) {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = paVar5;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x399773,&local_d0);
      value_00 = extraout_EDX_07;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      value_00 = extraout_EDX_08;
    }
    bVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2;
    _Var11._M_p = local_b0._M_dataplus._M_p;
  }
  lVar12 = local_90;
  if (!bVar1) {
    operator_delete(_Var11._M_p);
    value_00 = extraout_EDX_11;
  }
LAB_002685d5:
  if (lVar12 == 0) {
    if (*(int *)(field + 0x3c) == 3) {
      pcVar10 = "$this->^name^ = $arr;\n";
    }
    else {
      pcVar10 = "$this->^name^ = $var;\n";
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,pcVar10,(char (*) [5])0x3958cc,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    IntToString_abi_cxx11_(&local_d0,(php *)(ulong)*(uint *)(field + 0x44),value_00);
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,"$this->writeOneof(^number^, $var);\n",(char (*) [7])0x3b3c9d,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (is_descriptor) {
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"$this->has_^field_name^ = true;\n",(char (*) [11])0x3b3b74,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  io::Printer::Print<>(printer,"\nreturn $this;\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b0._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
               (FieldDescriptor **)&local_b0);
  }
  if (((*(int *)(field + 0x38) != 0xb) ||
      (bVar1 = FieldDescriptor::is_map_message_type(field), !bVar1)) &&
     (*(int *)(field + 0x3c) != 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                 (FieldDescriptor **)&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        pDVar3 = FieldDescriptor::message_type(field);
        iVar2 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar3 + 0x10));
        if (iVar2 == 0) {
          GenerateWrapperFieldSetterDocComment(printer,field);
          UnderscoresToCamelCase(&local_d0,*(string **)field,true);
          pDVar3 = FieldDescriptor::message_type(field);
          LegacyFullClassName<google::protobuf::Descriptor>(&local_b0,pDVar3,is_descriptor);
          io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                    (printer,
                     "public function set^camel_name^Unwrapped($var)\n{\n    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^([\'value\' => $var]);\n    return $this->set^camel_name^($wrappedVar);\n}\n\n"
                     ,(char (*) [11])"camel_name",&local_d0,(char (*) [13])"wrapper_type",&local_b0)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
      }
    }
  }
  if (is_descriptor) {
    UnderscoresToCamelCase(&local_d0,*(string **)field,true);
    io::Printer::Print<char[11],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "public function has^camel_name^()\n{\n    return $this->has_^field_name^;\n}\n\n",
               (char (*) [11])"camel_name",&local_d0,(char (*) [11])0x3b3b74,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    $wrapper = $this->get^camel_name^();\n"
        "    return is_null($wrapper) ? null : $wrapper->getValue();\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, is_descriptor, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^(['value' => $var]);\n"
        "    return $this->set^camel_name^($wrappedVar);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "wrapper_type", LegacyFullClassName(field->message_type(), is_descriptor));
  }

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}